

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

QString * QtMWidgets::accomodateString
                    (QString *__return_storage_ptr__,QString *text,QRect *r,int flags,
                    QStyleOption *opt)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QRect *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  QString tmp;
  QString local_78;
  QString *local_60;
  QString local_58;
  QRect *local_40;
  QRect *local_38;
  
  local_40 = (QRect *)(opt + 0x20);
  iVar4 = QFontMetrics::boundingRect
                    (local_40,(int)r,(QString *)(ulong)(uint)flags,(int)text,(int *)0x0);
  pDVar1 = (text->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (text->d).ptr;
  (__return_storage_ptr__->d).size = (text->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((r->x2 - r->x1) + 1 < (extraout_EDX - iVar4) + 1) {
    if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,8);
        }
      }
    }
    local_60 = __return_storage_ptr__;
    if (-2 < (r->x2 - r->x1) + 1) {
      do {
        QString::append((QChar)(char16_t)__return_storage_ptr__);
        iVar4 = QFontMetrics::boundingRect
                          (local_40,(int)r,(QString *)(ulong)(uint)flags,(int)__return_storage_ptr__
                           ,(int *)0x0);
        iVar5 = r->x2 - r->x1;
      } while ((extraout_EDX_00 - iVar4) + 1 <= (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1);
    }
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = L"...";
    local_58.d.size = 3;
    QString::append(__return_storage_ptr__);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    QString::QString(&local_58,
                     (QChar)*(char16_t *)
                             ((long)(text->d).ptr +
                             (((text->d).size << 0x20) + -0x100000000 >> 0x1f)));
    local_38 = r;
    while( true ) {
      pQVar3 = local_38;
      local_78.d.d = (local_60->d).d;
      local_78.d.ptr = (local_60->d).ptr;
      local_78.d.size = (local_60->d).size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append(&local_78);
      iVar6 = QFontMetrics::boundingRect
                        (local_40,(int)pQVar3,(QString *)(ulong)(uint)flags,(int)&local_78,
                         (int *)0x0);
      iVar4 = pQVar3->x2;
      iVar5 = pQVar3->x1;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
        }
      }
      if ((iVar4 - iVar5) + 1 < (extraout_EDX_01 - iVar6) + 1) break;
      QString::insert((longlong)&local_58,(QChar)0x0);
    }
    QString::right((longlong)&local_78);
    __return_storage_ptr__ = local_60;
    QString::append(local_60);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString
accomodateString( const QString & text, const QRect & r,
	int flags, const QStyleOption & opt )
{
	const QRect & b = opt.fontMetrics.boundingRect( r, flags, text );

	QString res = text;

	if( b.width() > r.width() )
	{
		int w = 0;
		int x = 0;

		res.clear();

		while( w <= ( r.width() ) / 2 )
		{
			res.append( text.at( x ) );
			++x;
			w = opt.fontMetrics.boundingRect( r, flags, res ).width();
		}

		res.append( QStringLiteral( "..." ) );

		x = text.length() - 1;

		QString tmp = text.at( x );

		while( opt.fontMetrics.boundingRect( r, flags, res + tmp ).width() <= r.width() )
		{
			--x;
			tmp.prepend( text.at( x ) );
		}

		res.append( text.right( text.length() - x - 1 ) );
	}

	return res;
}